

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O0

Vector<float,_4> __thiscall
rr::readVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  undefined1 auVar2 [12];
  undefined8 uVar3;
  Vector<float,_4> VVar1;
  int fragNdx_local;
  int varyingLoc_local;
  FragmentShadingContext *context_local;
  FragmentPacket *packet_local;
  
  if (context->varyings[1] == (GenericVec4 *)0x0) {
    VVar1 = readPointVarying<float>
                      ((FragmentPacket *)this,(FragmentShadingContext *)packet,(int)context,
                       varyingLoc);
  }
  else if (context->varyings[2] == (GenericVec4 *)0x0) {
    VVar1 = readLineVarying<float>(this,packet,context,varyingLoc,fragNdx);
  }
  else {
    VVar1 = readTriangleVarying<float>(this,packet,context,varyingLoc,fragNdx);
  }
  VVar1.m_data[0] = VVar1.m_data[0];
  auVar2._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vector<float,_4>)VVar1.m_data;
}

Assistant:

tcu::Vector<T, 4> readVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	if (context.varyings[1] == DE_NULL)	return readPointVarying<T>		(packet, context, varyingLoc, fragNdx);
	if (context.varyings[2] == DE_NULL)	return readLineVarying<T>		(packet, context, varyingLoc, fragNdx);
										return readTriangleVarying<T>	(packet, context, varyingLoc, fragNdx);
}